

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

int __thiscall glslang::TArraySizes::getCumulativeSize(TArraySizes *this)

{
  int iVar1;
  uint uVar2;
  int local_18;
  int local_14;
  int d;
  int size;
  TArraySizes *this_local;
  
  local_14 = 1;
  local_18 = 0;
  while( true ) {
    iVar1 = TSmallArrayVector::size(&this->sizes);
    if (iVar1 <= local_18) {
      return local_14;
    }
    uVar2 = TSmallArrayVector::getDimSize(&this->sizes,local_18);
    if (uVar2 == 0) break;
    uVar2 = TSmallArrayVector::getDimSize(&this->sizes,local_18);
    local_14 = uVar2 * local_14;
    local_18 = local_18 + 1;
  }
  __assert_fail("sizes.getDimSize(d) != UnsizedArraySize",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0x103,"int glslang::TArraySizes::getCumulativeSize() const");
}

Assistant:

int getCumulativeSize() const
    {
        int size = 1;
        for (int d = 0; d < sizes.size(); ++d) {
            // this only makes sense in paths that have a known array size
            assert(sizes.getDimSize(d) != UnsizedArraySize);
            size *= sizes.getDimSize(d);
        }
        return size;
    }